

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::elementDecl
          (AbstractDOMParser *this,DTDElementDecl *decl,bool param_2)

{
  XMLBuffer *this_00;
  bool bVar1;
  int iVar2;
  XMLCh *chars;
  undefined4 extraout_var;
  
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'!');
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgElemString);
    XMLBuffer::append(this->fInternalSubset,L' ');
    this_00 = this->fInternalSubset;
    chars = XMLElementDecl::getFullName(&decl->super_XMLElementDecl);
    XMLBuffer::append(this_00,chars);
    iVar2 = (*(decl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])(decl);
    if ((XMLCh *)CONCAT44(extraout_var,iVar2) != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)CONCAT44(extraout_var,iVar2));
    }
    XMLBuffer::append(this->fInternalSubset,L'>');
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::elementDecl
(
    const   DTDElementDecl& decl
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgElemString);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(decl.getFullName());

        //get the ContentSpec information
        const XMLCh* contentModel = decl.getFormattedContentModel();
        if (contentModel != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(contentModel);
        }

        fInternalSubset.append(chCloseAngle);
    }
}